

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.h
# Opt level: O1

vm_obj_id_t __thiscall
CVmObjClass::find_intcls_for_mod(CVmObjClass *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)self;
  while( true ) {
    uVar2 = *(uint *)((this->super_CVmObject).ext_ + 4);
    if (uVar2 != 0) {
      if (uVar2 == mod_obj) {
        return (vm_obj_id_t)uVar3;
      }
      iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 0x38))
                        (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),mod_obj);
      if (iVar1 != 0) {
        return (vm_obj_id_t)uVar3;
      }
    }
    iVar1 = (*(this->super_CVmObject)._vptr_CVmObject[8])(this,uVar3);
    if (iVar1 == 0) {
      return 0;
    }
    uVar2 = (*(this->super_CVmObject)._vptr_CVmObject[9])(this,uVar3,0);
    if (uVar2 == 0) break;
    uVar3 = (ulong)uVar2;
    this = (CVmObjClass *)
           ((long)&G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_ + (ulong)((uVar2 & 0xfff) * 0x18));
  }
  return 0;
}

Assistant:

vm_obj_id_t find_intcls_for_mod(VMG_ vm_obj_id_t self,
                                    vm_obj_id_t mod_obj)
    {
        /*
         *   The implementation is very simple: just look for a modifier
         *   object attached to this object or one of its intrinsic
         *   superclasses.  The difference between this and the regular
         *   CVmObject implementation is that the CVmObject implementation
         *   looks in the object's metaclass; we simply look in our intrinsic
         *   superclasses directly, since, for reflection purposes, we are
         *   our own metaclass.  
         */
        return find_mod_src_obj(vmg_ self, mod_obj);
    }